

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

int __thiscall
CVmObjLookupTable::getp_key_present
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_lookup_val *pvVar2;
  vm_val_t *in_RCX;
  vm_val_t *in_RDX;
  CVmNativeCodeDesc *in_RDI;
  vm_val_t key;
  vm_lookup_val *entry;
  uint *in_stack_ffffffffffffffb0;
  vm_val_t *in_stack_ffffffffffffffb8;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffc8;
  uint *in_stack_ffffffffffffffd0;
  
  if ((getp_key_present(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_key_present(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_key_present::desc,1);
    __cxa_guard_release(&getp_key_present(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_RDI)
  ;
  if (iVar1 == 0) {
    CVmStack::pop((vm_val_t *)&stack0xffffffffffffffc0);
    pvVar2 = find_entry((CVmObjLookupTable *)in_RDX,in_RCX,in_stack_ffffffffffffffd0,
                        (vm_lookup_val **)in_stack_ffffffffffffffc8.ptr);
    vm_val_t::set_logical(in_RDX,(uint)(pvVar2 != (vm_lookup_val *)0x0));
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_key_present(VMG_ vm_obj_id_t self,
                                        vm_val_t *retval, uint *argc)
{
    vm_lookup_val *entry;
    vm_val_t key;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the key */
    G_stk->pop(&key);
    
    /* find the entry for this key */
    entry = find_entry(vmg_ &key, 0, 0);

    /* return true if we found it, nil if not */
    retval->set_logical(entry != 0);

    /* handled */
    return TRUE;
}